

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O3

void __thiscall FTagManager::AddSectorTag(FTagManager *this,int sector,int tag)

{
  uint *puVar1;
  uint uVar2;
  FTagItem *pFVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  
  if (tag != 0) {
    if ((uint)sector < (this->startForSector).Count) {
      piVar6 = (this->startForSector).Array;
    }
    else {
      do {
        TArray<int,_int>::Grow(&this->startForSector,1);
        piVar6 = (this->startForSector).Array;
        piVar6[(this->startForSector).Count] = -1;
        uVar4 = (this->startForSector).Count + 1;
        (this->startForSector).Count = uVar4;
      } while (uVar4 <= (uint)sector);
    }
    uVar4 = piVar6[sector];
    uVar2 = (this->allTags).Count;
    if ((ulong)uVar4 == 0xffffffff) {
      piVar6[sector] = uVar2;
    }
    else if (uVar4 < uVar2) {
      piVar6 = &(this->allTags).Array[uVar4].tag;
      iVar5 = uVar2 - uVar4;
      do {
        if (*piVar6 == tag) {
          return;
        }
        piVar6 = piVar6 + 3;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    TArray<FTagItem,_FTagItem>::Grow(&this->allTags,1);
    pFVar3 = (this->allTags).Array;
    uVar4 = (this->allTags).Count;
    pFVar3[uVar4].target = sector;
    pFVar3[uVar4].tag = tag;
    pFVar3[uVar4].nexttag = -1;
    puVar1 = &(this->allTags).Count;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void FTagManager::AddSectorTag(int sector, int tag)
{
	if (tag == 0) return;

	// This function assumes that all tags for a single sector get added sequentially.
	// Should there ever be some need for compatibility.txt to add tags to sectors which already have a tag this function needs to be changed to adjust the startForSector indices.
	while (startForSector.Size() <= (unsigned int)sector)
	{
		startForSector.Push(-1);
	}
	if (startForSector[sector] == -1)
	{
		startForSector[sector] = allTags.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForSector[sector]; i < allTags.Size(); i++)
		{
			if (allTags[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { sector, tag, -1 };
	allTags.Push(it);
}